

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetPHINFToolInfo(ndicapi *pol,char *information)

{
  int i;
  long lVar1;
  
  lVar1 = 0;
  do {
    information[lVar1] = pol->PhinfBasic[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1f);
  return pol->PhinfUnoccupied;
}

Assistant:

ndicapiExport int ndiGetPHINFToolInfo(ndicapi* pol, char information[31])
{
  char* dp;
  int i;

  dp = pol->PhinfBasic;

  for (i = 0; i < 31; i++)
  {
    information[i] = *dp++;
  }

  return pol->PhinfUnoccupied;
}